

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-invert-images.cc
# Opt level: O2

void __thiscall ImageInverter::ImageInverter(ImageInverter *this)

{
  _Rb_tree_header *p_Var1;
  
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,false);
  *(undefined ***)this = &PTR__ImageInverter_00107c80;
  p_Var1 = &(this->copied_images)._M_t._M_impl.super__Rb_tree_header;
  (this->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->copied_images)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->copied_images)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

~ImageInverter() override = default;